

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

bool __thiscall UnifiedRegex::CharSet<char16_t>::Get_helper(CharSet<char16_t> *this,uint k)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined **ppuVar5;
  
  ppuVar5 = (undefined **)(this->rep).compact.countPlusOne;
  if ((long)ppuVar5 - 1U < 5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x511,"(!IsCompact())","!IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    ppuVar5 = (undefined **)(this->rep).compact.countPlusOne;
  }
  iVar4 = 0xc;
  while( true ) {
    bVar2 = ppuVar5 == &CharSetFull::Instance;
    if (iVar4 + -4 == 0) {
      if (ppuVar5 == &CharSetFull::Instance) {
        return true;
      }
      bVar2 = CharBitvec::Get((CharBitvec *)(ppuVar5 + 1),k & 0xff);
      return bVar2;
    }
    if (ppuVar5 == &CharSetFull::Instance) break;
    ppuVar5 = (undefined **)ppuVar5[(ulong)(k >> ((byte)iVar4 & 0x1f) & 0xf) + 1];
    iVar4 = iVar4 + -4;
    if (ppuVar5 == (undefined **)0x0) {
      return bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool CharSet<char16>::Get_helper(uint k) const
    {
        Assert(!IsCompact());
        CharSetNode* curr = rep.full.root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }